

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateManager.cpp
# Opt level: O3

void __thiscall
TemplateManager::GetTemplates
          (TemplateManager *this,TYPE_ID s,KEY_ID p,TYPE_ID o,unsigned_short scope,
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          *tripleTmpl)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  iterator iVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Self __tmp;
  _Base_ptr p_Var6;
  undefined2 in_register_00000082;
  _Self __tmp_1;
  bool bVar7;
  key_type local_78;
  _Rb_tree_node_base *local_58;
  _Self __tmp_2;
  __hashtable *__h;
  __node_gen_type __node_gen;
  
  __node_gen._M_h._4_4_ = CONCAT22(in_register_00000082,scope);
  local_78.ID = 0;
  local_78.subjectType = s;
  local_78.predicateID = p;
  local_78.objectType = o;
  local_78.scope = scope;
  if (((p == 0xffffffffffffffff) || (s == 0xffffffff)) || (o == 0xffffffff)) {
    local_58 = (this->templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    __tmp_2._M_node = &(this->templates)._M_t._M_impl.super__Rb_tree_header._M_header;
    if (local_58 != __tmp_2._M_node) {
      do {
        p_Var2 = local_58 + 1;
        for (p_Var4 = *(_Rb_tree_node_base **)(local_58 + 2);
            p_Var4 != (_Rb_tree_node_base *)&p_Var2->_M_left;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          if (((((s == 0xffffffff) || (*(TYPE_ID *)&p_Var4[1]._M_parent == s)) &&
               ((o == 0xffffffff || (*(TYPE_ID *)&p_Var4[1]._M_right == o)))) &&
              ((p == 0xffffffffffffffff || (p_Var4[1]._M_left == (_Base_ptr)p)))) &&
             (*(short *)((long)&p_Var4[1]._M_right + 4) == (short)__node_gen._M_h._4_4_)) {
            __h = &tripleTmpl->_M_h;
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)tripleTmpl,p_Var4 + 1,&__h);
          }
        }
        local_58 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_58);
      } while (local_58 != __tmp_2._M_node);
    }
  }
  else {
    p_Var1 = &(this->templates)._M_t._M_impl.super__Rb_tree_header;
    if (scope == 0) {
      p_Var5 = (this->templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var6 = &p_Var1->_M_header;
      if (p_Var5 != (_Base_ptr)0x0) {
        do {
          bVar7 = (uint)*(size_t *)(p_Var5 + 1) < s;
          if (!bVar7) {
            p_Var6 = p_Var5;
          }
          p_Var5 = (&p_Var5->_M_left)[bVar7];
        } while (p_Var5 != (_Base_ptr)0x0);
        if ((((_Rb_tree_header *)p_Var6 != p_Var1) &&
            ((uint)((_Rb_tree_header *)p_Var6)->_M_node_count <= s)) &&
           (iVar3 = std::
                    _Rb_tree<TripleTemplate,_TripleTemplate,_std::_Identity<TripleTemplate>,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>
                    ::find((_Rb_tree<TripleTemplate,_TripleTemplate,_std::_Identity<TripleTemplate>,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>
                            *)((long)p_Var6 + 0x28),&local_78),
           iVar3._M_node != (_Base_ptr)((undefined1 *)((long)p_Var6 + 0x28) + 8))) {
          __h = &tripleTmpl->_M_h;
          std::
          _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                    ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)tripleTmpl,iVar3._M_node + 1);
        }
      }
    }
    else {
      p_Var4 = (this->templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)p_Var4 != p_Var1) {
        do {
          iVar3 = std::
                  _Rb_tree<TripleTemplate,_TripleTemplate,_std::_Identity<TripleTemplate>,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>
                  ::find((_Rb_tree<TripleTemplate,_TripleTemplate,_std::_Identity<TripleTemplate>,_std::less<TripleTemplate>,_std::allocator<TripleTemplate>_>
                          *)&p_Var4[1]._M_parent,&local_78);
          if (iVar3._M_node != (_Base_ptr)&p_Var4[1]._M_left) {
            __h = &tripleTmpl->_M_h;
            std::
            _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                      ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)tripleTmpl,iVar3._M_node + 1,&__h);
          }
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        } while ((_Rb_tree_header *)p_Var4 != p_Var1);
      }
    }
  }
  return;
}

Assistant:

void TemplateManager::GetTemplates(TYPE_ID s, KEY_ID p, TYPE_ID o, unsigned short int scope, unordered_set<size_t>* tripleTmpl) {

	map<TYPE_ID, set<TripleTemplate> >::iterator it_templates;
	set<TripleTemplate>::iterator it_triple;

	TripleTemplate tmp;
	tmp.subjectType = s;
	tmp.predicateID = p;
	tmp.objectType = o;
	tmp.scope = scope;

	if (s != (TYPE_ID) -1 and o != (TYPE_ID) -1 and p != (KEY_ID) -1) { //FIXME, this is kinda hack, should find better way for wildcards
		if (scope == 0 and s != (TYPE_ID) -1) {
			it_templates = templates.find(s);
			if (it_templates != templates.end()) {
				it_triple = it_templates->second.find(tmp);
				if (it_triple != it_templates->second.end()) {
					tripleTmpl->insert(it_triple->ID);
				}
			}
		} else {
			for (it_templates = templates.begin(); it_templates != templates.end(); it_templates++) {
				it_triple = it_templates->second.find(tmp);
				if (it_triple != it_templates->second.end()) {
					tripleTmpl->insert(it_triple->ID);
				}
			}
		}
	} else {
		//FIXME this is a "slow" hack, find a "normal" solution to work with wildcards
//		cerr << "nie jest zle\ts:" << s << "\to: " << o << endl;
		for (it_templates = templates.begin(); it_templates != templates.end(); it_templates++) {
			for (it_triple = it_templates->second.begin(); it_triple != it_templates->second.end(); it_triple++) {
				if ((it_triple->subjectType == s or s == (TYPE_ID) -1) and (it_triple->objectType == o or o == (TYPE_ID) -1) and (it_triple->predicateID == p or p == (KEY_ID) -1)
						and it_triple->scope == scope) {
					tripleTmpl->insert(it_triple->ID);
				}
			}
		}

	}

}